

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void pputrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  ssize_t sVar1;
  undefined1 local_39;
  int local_38;
  int iStack_34;
  uchar c;
  int j;
  int i;
  int fd;
  int r_local;
  int sy_local;
  int sx_local;
  float *bf_local;
  uchar *hd_local;
  char *fn_local;
  
  i = r;
  fd = sy;
  r_local = sx;
  _sy_local = bf;
  bf_local = (float *)hd;
  hd_local = (uchar *)fn;
  j = creat(fn,0x180);
  if (j < 1) {
    error(9);
  }
  else {
    sVar1 = write(j,bf_local,0x20);
    if (sVar1 == 0x20) {
      for (iStack_34 = 0; iStack_34 < fd; iStack_34 = iStack_34 + 1) {
        for (local_38 = 0; local_38 < r_local; local_38 = local_38 + 1) {
          local_39 = (undefined1)(int)_sy_local[i * iStack_34 + local_38];
          sVar1 = write(j,&local_39,1);
          if (sVar1 != 1) {
            error(7);
          }
        }
      }
    }
    else {
      error(8);
    }
  }
  close(j);
  return;
}

Assistant:

void pputrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    if (write(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          c = (unsigned char)bf[r*i + j] ;
          if (write(fd,&c,sizeof(c)) != 1) {
            error(7) ;
          }
        }
      }
    }
    else {
      error(8) ;
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}